

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O2

void __thiscall miniros::NodeHandle::NodeHandle(NodeHandle *this,string *ns,M_string *remappings)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  string tilde_resolved_ns;
  string local_48;
  
  psVar2 = this_node::getNamespace_abi_cxx11_();
  std::__cxx11::string::string((string *)this,(string *)psVar2);
  (this->unresolved_namespace_)._M_dataplus._M_p = (pointer)&(this->unresolved_namespace_).field_2;
  (this->unresolved_namespace_)._M_string_length = 0;
  (this->unresolved_namespace_).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->remappings_)._M_t._M_impl.super__Rb_tree_header;
  (this->remappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->remappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->remappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->remappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->remappings_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->unresolved_remappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->unresolved_remappings_)._M_t._M_impl.super__Rb_tree_header;
  (this->unresolved_remappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->unresolved_remappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->unresolved_remappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->unresolved_remappings_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->callback_queue_ = (CallbackQueueInterface *)0x0;
  this->collection_ = (NodeHandleBackingCollection *)0x0;
  tilde_resolved_ns._M_dataplus._M_p = (pointer)&tilde_resolved_ns.field_2;
  tilde_resolved_ns._M_string_length = 0;
  tilde_resolved_ns.field_2._M_local_buf[0] = '\0';
  if ((ns->_M_string_length == 0) || (*(ns->_M_dataplus)._M_p != '~')) {
    std::__cxx11::string::_M_assign((string *)&tilde_resolved_ns);
  }
  else {
    names::resolve(&local_48,ns,true);
    std::__cxx11::string::operator=((string *)&tilde_resolved_ns,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  construct(this,&tilde_resolved_ns,true);
  initRemappings(this,remappings);
  std::__cxx11::string::~string((string *)&tilde_resolved_ns);
  return;
}

Assistant:

NodeHandle::NodeHandle(const std::string& ns, const M_string& remappings)
  : namespace_(this_node::getNamespace())
  , callback_queue_(0)
  , collection_(0)
{
  std::string tilde_resolved_ns;
  if (!ns.empty() && ns[0] == '~')// starts with tilde
    tilde_resolved_ns = names::resolve(ns);
  else
    tilde_resolved_ns = ns;

  construct(tilde_resolved_ns, true);

  initRemappings(remappings);
}